

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int source_get_outcomes(SOURCE_HANDLE source,AMQP_VALUE *outcomes_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  char *outcomes_single_value;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar3 = 0x336f;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(source->composite_value,&item_count);
    iVar3 = 0x3377;
    if ((iVar1 == 0) && (iVar3 = 0x337d, 9 < item_count)) {
      pAVar4 = amqpvalue_get_composite_item_in_place(source->composite_value,9);
      iVar3 = 0x3385;
      if ((pAVar4 != (AMQP_VALUE)0x0) &&
         (AVar2 = amqpvalue_get_type(pAVar4), AVar2 != AMQP_TYPE_NULL)) {
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          outcomes_single_value = (char *)0x0;
          bVar5 = true;
        }
        else {
          iVar3 = amqpvalue_get_symbol(pAVar4,&outcomes_single_value);
          bVar5 = iVar3 != 0;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          iVar3 = amqpvalue_get_array(pAVar4,outcomes_value);
          if ((bool)(iVar3 != 0 & bVar5)) {
            return 0x3398;
          }
        }
        else if (bVar5) {
          return 0x3398;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        iVar3 = 0;
        if (AVar2 != AMQP_TYPE_ARRAY) {
          pAVar4 = amqpvalue_create_array();
          *outcomes_value = pAVar4;
          if (pAVar4 == (AMQP_VALUE)0x0) {
            iVar3 = 0x33a1;
          }
          else {
            pAVar4 = amqpvalue_create_symbol(outcomes_single_value);
            if (pAVar4 == (AMQP_VALUE)0x0) {
              iVar3 = 0x33a8;
            }
            else {
              iVar1 = amqpvalue_add_array_item(*outcomes_value,pAVar4);
              iVar3 = 0x33ae;
              if (iVar1 == 0) {
                iVar1 = amqpvalue_set_composite_item(source->composite_value,9,*outcomes_value);
                iVar3 = 0x33b4;
                if (iVar1 == 0) {
                  iVar3 = 0;
                }
              }
              amqpvalue_destroy(pAVar4);
            }
            amqpvalue_destroy(*outcomes_value);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int source_get_outcomes(SOURCE_HANDLE source, AMQP_VALUE* outcomes_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        if (amqpvalue_get_composite_item_count(source_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 9)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(source_instance->composite_value, 9);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* outcomes_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &outcomes_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&outcomes_single_value, 0, sizeof(outcomes_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, outcomes_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *outcomes_value = amqpvalue_create_array();
                            if (*outcomes_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(outcomes_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*outcomes_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(source_instance->composite_value, 9, *outcomes_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*outcomes_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}